

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

int32_t decShiftToLeast(uint8_t *uar,int32_t units,int32_t shift)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t uVar5;
  uint8_t *puVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  
  iVar11 = (int)uar;
  if (shift != 0) {
    if (shift != units) {
      uVar12 = shift;
      if (shift < 0x32) {
        uVar12 = (uint)""[shift];
      }
      uVar10 = (long)(int)uVar12 - 1;
      iVar7 = shift - (int)uVar10;
      if (iVar7 == 1) {
        if (shift < 0x32) {
          shift = (int32_t)""[shift];
        }
        if (shift < units) {
          puVar6 = uar + units;
          do {
            puVar1 = uar + (uint)shift;
            *uar = *puVar1;
            uar = uar + 1;
          } while (puVar1 + 1 < puVar6);
        }
        iVar8 = (int)uar - iVar11;
      }
      else {
        if (uVar12 < 0x33) {
          uVar10 = (ulong)(byte)(&DAT_003020af)[(int)uVar12];
        }
        uVar2 = multies[iVar7];
        uVar12 = (uar[uVar10 & 0xffffffff] >> ((byte)iVar7 & 0x1f)) * uVar2 >> 0x11;
        iVar14 = 1 - iVar7;
        *uar = (uint8_t)uVar12;
        iVar15 = (units - iVar14) - shift;
        if (0 < iVar15) {
          uVar3 = DECPOWERS[iVar7];
          uVar4 = DECPOWERS[iVar14];
          iVar9 = ~shift + units;
          do {
            uVar13 = (uar[(uVar10 & 0xffffffff) + 1] >> ((byte)iVar7 & 0x1f)) * uVar2 >> 0x11;
            uVar5 = (uint8_t)uVar13;
            *uar = (uar[(uVar10 & 0xffffffff) + 1] - uVar5 * (char)uVar3) * (char)uVar4 +
                   (char)uVar12;
            if (iVar9 < 1) break;
            uar[1] = uVar5;
            uar = uar + 1;
            iVar15 = (iVar15 - iVar7) - iVar14;
            iVar9 = iVar9 + -1;
            uVar12 = uVar13;
          } while (0 < iVar15);
        }
        iVar8 = ((int)uar - iVar11) + 1;
      }
      return iVar8;
    }
    *uar = '\0';
    units = 1;
  }
  return units;
}

Assistant:

static Int decShiftToLeast(Unit *uar, Int units, Int shift) {
  Unit  *target, *up;              /* work  */
  Int   cut, count;                /* work  */
  Int   quot, rem;                 /* for division  */

  if (shift==0) return units;      /* [fastpath] nothing to do  */
  if (shift==units*DECDPUN) {      /* [fastpath] little to do  */
    *uar=0;                        /* all digits cleared gives zero  */
    return 1;                      /* leaves just the one  */
    }

  target=uar;                      /* both paths  */
  cut=MSUDIGITS(shift);
  if (cut==DECDPUN) {              /* unit-boundary case; easy  */
    up=uar+D2U(shift);
    for (; up<uar+units; target++, up++) *target=*up;
    return static_cast<int32_t>(target-uar);
    }

  /* messier  */
  up=uar+D2U(shift-cut);           /* source; correct to whole Units  */
  count=units*DECDPUN-shift;       /* the maximum new length  */
  #if DECDPUN<=4
    quot=QUOT10(*up, cut);
  #else
    quot=*up/powers[cut];
  #endif
  for (; ; target++) {
    *target=(Unit)quot;
    count-=(DECDPUN-cut);
    if (count<=0) break;
    up++;
    quot=*up;
    #if DECDPUN<=4
      quot=QUOT10(quot, cut);
      rem=*up-quot*powers[cut];
    #else
      rem=quot%powers[cut];
      quot=quot/powers[cut];
    #endif
    *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
    count-=cut;
    if (count<=0) break;
    }
  return static_cast<int32_t>(target-uar+1);
  }